

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O3

vector<kiste::line_t,_std::allocator<kiste::line_t>_> *
kiste::parse(vector<kiste::line_t,_std::allocator<kiste::line_t>_> *__return_storage_ptr__,
            parse_context *ctx)

{
  pointer plVar1;
  char cVar2;
  bool bVar3;
  runtime_error *this;
  long lVar4;
  istream *piVar5;
  line_data_t line_data;
  line_data_t local_180;
  line_t local_e0;
  
  (__return_storage_ptr__->super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar5 = ctx->_is;
  lVar4 = *(long *)piVar5;
  if (*(int *)(piVar5 + *(long *)(lVar4 + -0x18) + 0x20) == 0) {
    do {
      ctx->_line_no = ctx->_line_no + 1;
      cVar2 = std::ios::widen((char)*(undefined8 *)(lVar4 + -0x18) + (char)piVar5);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (piVar5,(string *)&ctx->_line,cVar2);
      parse_line(&local_180,ctx);
      parse_context::update(ctx,&local_180);
      line_t::line_t(&local_e0,ctx,&local_180);
      std::vector<kiste::line_t,_std::allocator<kiste::line_t>_>::emplace_back<kiste::line_t>
                (__return_storage_ptr__,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.super_line_data_t._member.name._M_dataplus._M_p !=
          &local_e0.super_line_data_t._member.name.field_2) {
        operator_delete(local_e0.super_line_data_t._member.name._M_dataplus._M_p,
                        local_e0.super_line_data_t._member.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.super_line_data_t._member.class_name._M_dataplus._M_p !=
          &local_e0.super_line_data_t._member.class_name.field_2) {
        operator_delete(local_e0.super_line_data_t._member.class_name._M_dataplus._M_p,
                        local_e0.super_line_data_t._member.class_name.field_2._M_allocated_capacity
                        + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.super_line_data_t._class_data._parent_name._M_dataplus._M_p !=
          &local_e0.super_line_data_t._class_data._parent_name.field_2) {
        operator_delete(local_e0.super_line_data_t._class_data._parent_name._M_dataplus._M_p,
                        local_e0.super_line_data_t._class_data._parent_name.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0.super_line_data_t._class_data._name._M_dataplus._M_p !=
          &local_e0.super_line_data_t._class_data._name.field_2) {
        operator_delete(local_e0.super_line_data_t._class_data._name._M_dataplus._M_p,
                        local_e0.super_line_data_t._class_data._name.field_2._M_allocated_capacity +
                        1);
      }
      std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector
                (&local_e0.super_line_data_t._segments);
      plVar1 = (__return_storage_ptr__->
               super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar4 = (long)(__return_storage_ptr__->
                    super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)plVar1;
      if (2 < (ulong)((lVar4 >> 4) * 0x2e8ba2e8ba2e8ba3)) {
        bVar3 = line_t::ends_with_text((line_t *)((long)plVar1 + lVar4 + -0x160));
        *(bool *)((long)plVar1 + lVar4 + -8) = bVar3;
        bVar3 = line_t::starts_with_text((line_t *)((long)plVar1 + lVar4 + -0xb0));
        *(bool *)((long)plVar1 + lVar4 + -0xb7) = bVar3;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._member.name._M_dataplus._M_p != &local_180._member.name.field_2) {
        operator_delete(local_180._member.name._M_dataplus._M_p,
                        local_180._member.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._member.class_name._M_dataplus._M_p != &local_180._member.class_name.field_2)
      {
        operator_delete(local_180._member.class_name._M_dataplus._M_p,
                        local_180._member.class_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._class_data._parent_name._M_dataplus._M_p !=
          &local_180._class_data._parent_name.field_2) {
        operator_delete(local_180._class_data._parent_name._M_dataplus._M_p,
                        local_180._class_data._parent_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._class_data._name._M_dataplus._M_p != &local_180._class_data._name.field_2) {
        operator_delete(local_180._class_data._name._M_dataplus._M_p,
                        local_180._class_data._name.field_2._M_allocated_capacity + 1);
      }
      std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector
                (&local_180._segments);
      piVar5 = ctx->_is;
      lVar4 = *(long *)piVar5;
    } while (*(int *)(piVar5 + *(long *)(lVar4 + -0x18) + 0x20) == 0);
    plVar1 = (__return_storage_ptr__->
             super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (((__return_storage_ptr__->super__Vector_base<kiste::line_t,_std::allocator<kiste::line_t>_>)
         ._M_impl.super__Vector_impl_data._M_start != plVar1) && (plVar1[-1]._curly_level != 0)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"not enough closing curly braces");
      *(undefined ***)this = &PTR__runtime_error_0010cd88;
      __cxa_throw(this,&parse_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse(parse_context& ctx) -> std::vector<line_t>
  {
    auto lines = std::vector<line_t>{};

    while (ctx._is.good())
    {
      ++ctx._line_no;
      getline(ctx._is, ctx._line);

      const auto line_data = parse_line(ctx);
      ctx.update(line_data);
      lines.push_back({ctx, line_data});

      if (lines.size() > 2)
      {
        auto& line = lines.at(lines.size() - 1);
        auto& previous_line = lines.at(lines.size() - 2);
        line._previous_line_ends_with_text = previous_line.ends_with_text();
        previous_line._next_line_starts_with_text = line.starts_with_text();
      }
    }
    if (not lines.empty() and lines.back()._curly_level)
    {
      throw parse_error("not enough closing curly braces");
    }

    return lines;
  }